

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmMakefile *makefile)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  cmMakefile *pcVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  string *psVar7;
  mapped_type *pmVar8;
  long *plVar9;
  mapped_type *pmVar10;
  long lVar11;
  cmState *pcVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  pointer __rhs;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_name;
  ulong uVar16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sysroots;
  string replaceVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  undefined1 local_1c8 [8];
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_140;
  undefined1 local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_d0;
  string *local_c8;
  string *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cmOutputConverter *local_98;
  unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_> local_90;
  _Head_base<0UL,_cmGlobVerificationManager_*,_false> local_88;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmMakefile::GetStateSnapshot(makefile);
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,(cmStateSnapshot *)local_1c8);
  this->_vptr_cmLocalGenerator = (_func_int **)&PTR__cmLocalGenerator_00960770;
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->DirectoryBacktrace;
  cmMakefile::GetBacktrace(makefile);
  p_Var1 = &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_90._M_t.super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>._M_t.
  super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>.
  super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCacheManager,_std::default_delete<cmCacheManager>,_true,_true>)
       &this->EnvCPATH;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EnvCPATH).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EnvCPATH).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EnvCPATH).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_buckets =
       &(this->GeneratorTargetSearchIndex)._M_h._M_single_bucket;
  (this->GeneratorTargetSearchIndex)._M_h._M_bucket_count = 1;
  (this->GeneratorTargetSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_element_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_buckets =
       &(this->ImportedGeneratorTargets)._M_h._M_single_bucket;
  (this->ImportedGeneratorTargets)._M_h._M_bucket_count = 1;
  (this->ImportedGeneratorTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_element_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedGeneratorTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_head_impl = (cmGlobVerificationManager *)&this->Compilers;
  p_Var2 = &(this->Compilers)._M_t._M_impl.super__Rb_tree_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = &(this->CompilerSysroot).field_2;
  (this->CompilerSysroot)._M_dataplus._M_p = (pointer)local_58;
  (this->CompilerSysroot)._M_string_length = 0;
  (this->CompilerSysroot).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->LinkerSysroot).field_2;
  (this->LinkerSysroot)._M_dataplus._M_p = (pointer)local_60;
  (this->LinkerSysroot)._M_string_length = 0;
  (this->LinkerSysroot).field_2._M_local_buf[0] = '\0';
  (this->AppleArchSysroots)._M_h._M_buckets = &(this->AppleArchSysroots)._M_h._M_single_bucket;
  (this->AppleArchSysroots)._M_h._M_bucket_count = 1;
  (this->AppleArchSysroots)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AppleArchSysroots)._M_h._M_element_count = 0;
  (this->AppleArchSysroots)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AppleArchSysroots)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AppleArchSysroots)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OutputToSource)._M_h._M_buckets = &(this->OutputToSource)._M_h._M_single_bucket;
  local_140 = &this->VariableMappings;
  (this->OutputToSource)._M_h._M_bucket_count = 1;
  local_c0 = (string *)&this->CompilerSysroot;
  (this->OutputToSource)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->OutputToSource)._M_h._M_element_count = 0;
  (this->OutputToSource)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_c8 = (string *)&this->LinkerSysroot;
  (this->OutputToSource)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->OutputToSource)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->GlobalGenerator = gg;
  local_d0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->AppleArchSysroots;
  this->Makefile = makefile;
  local_98 = &this->super_cmOutputConverter;
  local_50 = (pointer)&this->AliasTargets;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1c8,&(makefile->AliasTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->AliasTargets)._M_t);
  if ((_Base_ptr)local_1b8._0_8_ != (_Base_ptr)0x0) {
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1c0._0_4_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_1b8._0_8_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1b8._8_8_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1b8._16_8_;
    *(_Rb_tree_header **)(local_1b8._0_8_ + 8) = p_Var1;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_1b8._24_8_;
    local_1b8._0_8_ = (_Base_ptr)0x0;
    local_1b8._24_8_ = (_Base_ptr)0x0;
    local_1b8._8_8_ = (_Base_ptr)local_1c0;
    local_1b8._16_8_ = (_Base_ptr)local_1c0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1c8);
  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
  ComputeObjectMaxPath(this);
  local_1b8._48_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_178._M_allocated_capacity = 0;
  cmsys::SystemTools::GetPath
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_1b8 + 0x30),"CPATH");
  paVar13 = paStack_180;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._48_8_ != paStack_180) {
    in_name = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._48_8_;
    do {
      bVar4 = cmsys::SystemTools::FileIsFullPath((string *)in_name);
      if (bVar4) {
        cmsys::SystemTools::CollapseFullPath((string *)local_1c8,(string *)in_name);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_90._M_t.
                   super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>._M_t.
                   super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>.
                   super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl,(string *)local_1c8);
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
        }
      }
      in_name = in_name + 2;
    } while (in_name != paVar13);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1b8 + 0x30));
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_48,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  pcVar3 = this->Makefile;
  local_1c8 = (undefined1  [8])local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_SYSROOT_COMPILE","");
  cVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
  }
  if (cVar6.Value == (string *)0x0) {
    pcVar3 = this->Makefile;
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1c8);
    std::__cxx11::string::_M_assign(local_c0);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
    }
  }
  else {
    std::__cxx11::string::_M_assign(local_c0);
  }
  pcVar3 = this->Makefile;
  local_1c8 = (undefined1  [8])local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_SYSROOT_LINK","");
  cVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
  }
  if (cVar6.Value == (string *)0x0) {
    pcVar3 = this->Makefile;
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1c8);
    std::__cxx11::string::_M_assign(local_c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
    }
  }
  else {
    std::__cxx11::string::_M_assign(local_c8);
  }
  pcVar3 = this->Makefile;
  local_1c8 = (undefined1  [8])local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CMAKE_APPLE_ARCH_SYSROOTS","");
  cVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
  }
  if (cVar6.Value != (string *)0x0) {
    pcVar3 = this->Makefile;
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CMAKE_OSX_ARCHITECTURES","");
    psVar7 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
    }
    local_158._M_allocated_capacity = 0;
    local_168._M_allocated_capacity = 0;
    local_168._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_138._16_8_ = (__node_base_ptr)0x0;
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    arg._M_str = (psVar7->_M_dataplus)._M_p;
    arg._M_len = psVar7->_M_string_length;
    cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_168,false);
    arg_00._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar6.Value)->_M_string_length;
    cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_138,true);
    if (local_168._8_8_ - local_168._0_8_ == local_138._8_8_ - local_138._0_8_) {
      if (local_168._8_8_ != local_168._M_allocated_capacity) {
        lVar15 = 0;
        uVar16 = 0;
        do {
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_d0,(key_type *)(local_168._M_allocated_capacity + lVar15));
          std::__cxx11::string::_M_assign((string *)pmVar8);
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 0x20;
        } while (uVar16 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 5));
      }
    }
    else {
      local_1b8._8_8_ = ((cVar6.Value)->_M_dataplus)._M_p;
      local_1b8._0_8_ = (cVar6.Value)->_M_string_length;
      local_1c8 = (undefined1  [8])0x1d;
      local_1c0 = (undefined1  [8])0x76761a;
      local_1b8._16_8_ = (_Base_ptr)0x36;
      local_1b8._24_8_ = "\nis not the same length as CMAKE_OSX_ARCHITECTURES:\n  ";
      local_1b8._40_8_ = (psVar7->_M_dataplus)._M_p;
      local_1b8._32_8_ = psVar7->_M_string_length;
      views._M_len = 4;
      views._M_array = (iterator)local_1c8;
      cmCatViews_abi_cxx11_((string *)(local_1b8 + 0x30),views);
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                          (string *)(local_1b8 + 0x30),(cmListFileBacktrace *)local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._48_8_ != &local_178) {
        operator_delete((void *)local_1b8._48_8_,(ulong)(local_178._M_allocated_capacity + 1));
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
  }
  local_118 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __rhs = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1b8 + 0x30),"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)(local_1b8 + 0x30));
        local_1c8 = (undefined1  [8])local_1b8;
        pcVar12 = (cmState *)(plVar9 + 2);
        if ((cmState *)*plVar9 == pcVar12) {
          local_1b8._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions).Map_._M_t._M_impl;
          local_1b8._8_8_ = plVar9[3];
        }
        else {
          local_1b8._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions).Map_._M_t._M_impl;
          local_1c8 = (undefined1  [8])*plVar9;
        }
        local_1c0 = (undefined1  [8])plVar9[1];
        *plVar9 = (long)pcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_88._M_head_impl,(key_type *)local_1c8);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._48_8_ != &local_178) {
          operator_delete((void *)local_1b8._48_8_,(ulong)(local_178._M_allocated_capacity + 1));
        }
        pcVar3 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1b8 + 0x30),"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)(local_1b8 + 0x30));
        local_1c8 = (undefined1  [8])local_1b8;
        pcVar12 = (cmState *)(plVar9 + 2);
        if ((cmState *)*plVar9 == pcVar12) {
          local_1b8._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions).Map_._M_t._M_impl;
          local_1b8._8_8_ = plVar9[3];
        }
        else {
          local_1b8._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions).Map_._M_t._M_impl;
          local_1c8 = (undefined1  [8])*plVar9;
        }
        local_1c0 = (undefined1  [8])plVar9[1];
        *plVar9 = (long)pcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1c8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_138);
        local_168._M_allocated_capacity = (size_type)&local_158;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar13) {
          local_158._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_158._8_8_ = plVar9[3];
        }
        else {
          local_158._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_168._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_168._8_8_ = plVar9[1];
        *plVar9 = (long)paVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,(key_type *)&local_168);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_allocated_capacity != &local_158) {
          operator_delete((void *)local_168._M_allocated_capacity,
                          local_158._M_allocated_capacity + 1);
        }
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
        }
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._48_8_ != &local_178) {
          operator_delete((void *)local_1b8._48_8_,(ulong)(local_178._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1b8 + 0x30),"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)(local_1b8 + 0x30));
        local_1c8 = (undefined1  [8])local_1b8;
        pcVar12 = (cmState *)(plVar9 + 2);
        if ((cmState *)*plVar9 == pcVar12) {
          local_1b8._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions).Map_._M_t._M_impl;
          local_1b8._8_8_ = plVar9[3];
        }
        else {
          local_1b8._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions).Map_._M_t._M_impl;
          local_1c8 = (undefined1  [8])*plVar9;
        }
        local_1c0 = (undefined1  [8])plVar9[1];
        *plVar9 = (long)pcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._48_8_ != &local_178) {
          operator_delete((void *)local_1b8._48_8_,(ulong)(local_178._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_168,"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append(local_168._M_local_buf);
        local_1b8._48_8_ = &local_178;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar13) {
          local_178._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_178._8_8_ = plVar9[3];
        }
        else {
          local_178._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1b8._48_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar9[1];
        *plVar9 = (long)paVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_allocated_capacity != &local_158) {
          operator_delete((void *)local_168._M_allocated_capacity,
                          local_158._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_138);
        local_168._M_allocated_capacity = (size_type)&local_158;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar13) {
          local_158._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_158._8_8_ = plVar9[3];
        }
        else {
          local_158._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_168._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_168._8_8_ = plVar9[1];
        *plVar9 = (long)paVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
        }
        std::operator+(&local_f0,"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_138._0_8_ = local_138 + 0x10;
        pbVar14 = (pointer)(plVar9 + 2);
        if ((pointer)*plVar9 == pbVar14) {
          local_138._16_8_ = (pbVar14->_M_dataplus)._M_p;
          local_138._24_8_ = plVar9[3];
        }
        else {
          local_138._16_8_ = (pbVar14->_M_dataplus)._M_p;
          local_138._0_8_ = (pointer)*plVar9;
        }
        local_138._8_8_ = plVar9[1];
        *plVar9 = (long)pbVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_110,"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar13) {
          local_f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_f0.field_2._8_8_ = plVar9[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_f0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_f0._M_string_length = plVar9[1];
        *plVar9 = (long)paVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_110 + 0x10U)) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_b8,"CMAKE_",__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_110._M_dataplus._M_p = (pointer)((long)&local_110 + 0x10);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar13) {
          local_110.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_110.field_2._8_8_ = plVar9[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_110._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_110._M_string_length = plVar9[1];
        *plVar9 = (long)paVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1c8);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,(key_type *)local_1c8);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)(local_1b8 + 0x30));
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,(key_type *)(local_1b8 + 0x30));
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)&local_168);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,(key_type *)&local_168);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_138);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,(key_type *)local_138);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_f0);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,&local_f0);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_110);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_140,&local_110);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        lVar15 = 0;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,*(char **)((long)&_ZGRL15ruleReplaceVars_ + lVar15),
                     (allocator<char> *)local_80);
          lVar11 = std::__cxx11::string::find((char *)&local_b8,0x7676c4,0);
          if (lVar11 != -1) {
            local_80._0_8_ = local_80 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"${LANG}","");
            cmsys::SystemTools::ReplaceString(&local_b8,(string *)local_80,__rhs);
            if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
              operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
            }
          }
          cmMakefile::GetSafeDefinition(this->Makefile,&local_b8);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](local_140,&local_b8);
          std::__cxx11::string::_M_assign((string *)pmVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_110 + 0x10U)) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_allocated_capacity != &local_158) {
          operator_delete((void *)local_168._M_allocated_capacity,
                          local_158._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._48_8_ != &local_178) {
          operator_delete((void *)local_1b8._48_8_,(ulong)(local_178._M_allocated_capacity + 1));
        }
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,(ulong)(local_1b8._0_8_ + 1));
        }
      }
      __rhs = __rhs + 1;
    } while (__rhs != local_118);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg, cmMakefile* makefile)
  : cmOutputConverter(makefile->GetStateSnapshot())
  , DirectoryBacktrace(makefile->GetBacktrace())
{
  this->GlobalGenerator = gg;

  this->Makefile = makefile;

  this->AliasTargets = makefile->GetAliasTargets();

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;

  this->ComputeObjectMaxPath();

  // Canonicalize entries of the CPATH environment variable the same
  // way detection of CMAKE_<LANG>_IMPLICIT_INCLUDE_DIRECTORIES does.
  {
    std::vector<std::string> cpath;
    cmSystemTools::GetPath(cpath, "CPATH");
    for (std::string const& cp : cpath) {
      if (cmSystemTools::FileIsFullPath(cp)) {
        this->EnvCPATH.emplace_back(cmSystemTools::CollapseFullPath(cp));
      }
    }
  }

  std::vector<std::string> enabledLanguages =
    this->GetState()->GetEnabledLanguages();

  if (cmValue sysrootCompile =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE")) {
    this->CompilerSysroot = *sysrootCompile;
  } else {
    this->CompilerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  if (cmValue sysrootLink =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    this->LinkerSysroot = *sysrootLink;
  } else {
    this->LinkerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  if (cmValue appleArchSysroots =
        this->Makefile->GetDefinition("CMAKE_APPLE_ARCH_SYSROOTS")) {
    std::string const& appleArchs =
      this->Makefile->GetSafeDefinition("CMAKE_OSX_ARCHITECTURES");
    std::vector<std::string> archs;
    std::vector<std::string> sysroots;
    cmExpandList(appleArchs, archs);
    cmExpandList(*appleArchSysroots, sysroots, true);
    if (archs.size() == sysroots.size()) {
      for (size_t i = 0; i < archs.size(); ++i) {
        this->AppleArchSysroots[archs[i]] = sysroots[i];
      }
    } else {
      std::string const e =
        cmStrCat("CMAKE_APPLE_ARCH_SYSROOTS:\n  ", *appleArchSysroots,
                 "\n"
                 "is not the same length as CMAKE_OSX_ARCHITECTURES:\n  ",
                 appleArchs);
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }
  }

  for (std::string const& lang : enabledLanguages) {
    if (lang == "NONE") {
      continue;
    }
    this->Compilers["CMAKE_" + lang + "_COMPILER"] = lang;

    this->VariableMappings["CMAKE_" + lang + "_COMPILER"] =
      this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER");

    std::string const& compilerArg1 = "CMAKE_" + lang + "_COMPILER_ARG1";
    std::string const& compilerTarget = "CMAKE_" + lang + "_COMPILER_TARGET";
    std::string const& compilerOptionTarget =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_TARGET";
    std::string const& compilerExternalToolchain =
      "CMAKE_" + lang + "_COMPILER_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionExternalToolchain =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionSysroot =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_SYSROOT";

    this->VariableMappings[compilerArg1] =
      this->Makefile->GetSafeDefinition(compilerArg1);
    this->VariableMappings[compilerTarget] =
      this->Makefile->GetSafeDefinition(compilerTarget);
    this->VariableMappings[compilerOptionTarget] =
      this->Makefile->GetSafeDefinition(compilerOptionTarget);
    this->VariableMappings[compilerExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerExternalToolchain);
    this->VariableMappings[compilerOptionExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerOptionExternalToolchain);
    this->VariableMappings[compilerOptionSysroot] =
      this->Makefile->GetSafeDefinition(compilerOptionSysroot);

    for (std::string replaceVar : ruleReplaceVars) {
      if (replaceVar.find("${LANG}") != std::string::npos) {
        cmSystemTools::ReplaceString(replaceVar, "${LANG}", lang);
      }

      this->VariableMappings[replaceVar] =
        this->Makefile->GetSafeDefinition(replaceVar);
    }
  }
}